

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void HTTPWorkQueueRun(WorkQueue<HTTPClosure> *queue,int worker_num)

{
  long in_FS_OFFSET;
  int local_3c;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = worker_num;
  tinyformat::format<int>(&local_38,"httpworker.%i",&local_3c);
  util::ThreadRename(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  WorkQueue<HTTPClosure>::Run(queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void HTTPWorkQueueRun(WorkQueue<HTTPClosure>* queue, int worker_num)
{
    util::ThreadRename(strprintf("httpworker.%i", worker_num));
    queue->Run();
}